

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O0

bool __thiscall
ON_CompressedBuffer::CompressionEnd(ON_CompressedBuffer *this,ON_CompressedBufferHelper *helper)

{
  bool local_19;
  bool rc;
  ON_CompressedBufferHelper *helper_local;
  ON_CompressedBuffer *this_local;
  
  local_19 = false;
  if (helper != (ON_CompressedBufferHelper *)0x0) {
    if (helper->m_action == 1) {
      z_deflateEnd(&helper->m_strm);
      local_19 = true;
    }
    else {
      local_19 = helper->m_action == 2;
      if (local_19) {
        z_inflateEnd(&helper->m_strm);
      }
    }
    memset(&helper->m_strm,0,0x58);
    helper->m_action = 0;
  }
  return local_19;
}

Assistant:

bool ON_CompressedBuffer::CompressionEnd( struct ON_CompressedBufferHelper* helper ) const
{
  bool rc = false;

  if ( helper )
  {
    // inflateEnd() and deflateEnd() are in zlib 1.3.3
    if (1 == helper->m_action)
    {
      // finish compression
      deflateEnd(&helper->m_strm);
      rc = true;
    }
    else if (2 == helper->m_action)
    {
      // finish decompression
      inflateEnd(&helper->m_strm);
      rc = true;
    }
    memset(&helper->m_strm, 0, sizeof(helper->m_strm));
    helper->m_action = 0;
  }

  return rc;
}